

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motd.cpp
# Opt level: O0

void __thiscall CMotd::OnRender(CMotd *this)

{
  bool bVar1;
  IGraphics *pIVar2;
  ITextRender *pIVar3;
  CMotd *in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  float y;
  float x;
  float w;
  float h;
  float TextSize;
  int MaxLines;
  float Width;
  float Height;
  CUIRect Rect;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  undefined4 uVar7;
  vector4_base<float> local_28;
  float local_18;
  undefined4 local_14;
  float local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsActive(in_RDI);
  if (bVar1) {
    CComponent::Graphics((CComponent *)0x1b2989);
    fVar4 = IGraphics::ScreenAspect
                      ((IGraphics *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    pIVar2 = CComponent::Graphics((CComponent *)0x1b29af);
    (*(pIVar2->super_IInterface)._vptr_IInterface[5])(0,0,fVar4 * 1200.0,0x44960000);
    uVar7 = 0x444c8000;
    uVar6 = 0x44228000;
    fVar4 = (fVar4 * 1200.0) / 2.0 - 325.0;
    uVar5 = 0x43160000;
    local_14 = 0x43160000;
    local_10 = 650.0;
    local_c = 0x444c8000;
    local_18 = fVar4;
    pIVar2 = CComponent::Graphics((CComponent *)0x1b2a73);
    (*(pIVar2->super_IInterface)._vptr_IInterface[8])();
    vector4_base<float>::vector4_base(&local_28,0.0,0.0,0.0,0.5);
    CUIRect::Draw((CUIRect *)this,_Width,(float)MaxLines,(int)TextSize);
    CUIRect::Margin((CUIRect *)CONCAT44(uVar7,uVar6),fVar4,(CUIRect *)in_RDI);
    (in_RDI->m_ServerMotdCursor).m_Flags = 0xe;
    (in_RDI->m_ServerMotdCursor).m_FontSize = 32.0;
    (in_RDI->m_ServerMotdCursor).m_MaxWidth = local_10;
    (in_RDI->m_ServerMotdCursor).m_MaxLines = 0x18;
    CTextCursor::Reset((CTextCursor *)CONCAT44(fVar4,uVar5),(int64)in_RDI);
    CTextCursor::MoveTo((CTextCursor *)CONCAT44(fVar4,uVar5),(float)((ulong)in_RDI >> 0x20),
                        SUB84(in_RDI,0));
    pIVar3 = CComponent::TextRender((CComponent *)0x1b2b36);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&in_RDI->m_ServerMotdCursor,in_RDI->m_aServerMotd,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMotd::OnRender()
{
	if(!IsActive())
		return;

	const float Height = 400.0f * 3.0f;
	const float Width = Height * Graphics()->ScreenAspect();

	Graphics()->MapScreen(0, 0, Width, Height);

	const int MaxLines = 24;
	const float TextSize = 32.0f;

	float h = MaxLines * TextSize + 2 * 25.0f;
	float w = 650.0f;
	float x = Width/2 - w/2;
	float y = 150.0f;
	CUIRect Rect = {x, y, w, h};

	Graphics()->BlendNormal();
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.5f), 30.0f);

	Rect.Margin(25.0f, &Rect);

	m_ServerMotdCursor.m_Flags = TEXTFLAG_ALLOW_NEWLINE | TEXTFLAG_WORD_WRAP | TEXTFLAG_ELLIPSIS;
	m_ServerMotdCursor.m_FontSize = TextSize;
	m_ServerMotdCursor.m_MaxWidth = Rect.w;
	m_ServerMotdCursor.m_MaxLines = MaxLines;

	m_ServerMotdCursor.Reset(m_ServerMotdTime);
	m_ServerMotdCursor.MoveTo(Rect.x, Rect.y);
	TextRender()->TextOutlined(&m_ServerMotdCursor, m_aServerMotd, -1);
}